

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void idct16_stage6_avx2(__m256i *x,int32_t *cospi,__m256i _r,int8_t cos_bit)

{
  __m256i cospi_p32_p32;
  __m256i cospi_m32_p32;
  int32_t in_stack_00000114;
  undefined1 in_stack_00000118 [32];
  __m256i *in_stack_00000148;
  __m256i *in_stack_00000150;
  undefined1 in_stack_00000158 [32];
  undefined1 in_stack_00000178 [32];
  undefined4 uVar1;
  undefined8 in_stack_ffffffffffffff50;
  __m256i *in_stack_ffffffffffffff88;
  __m256i *in_stack_ffffffffffffff90;
  
  uVar1 = (undefined4)in_stack_ffffffffffffff50;
  pair_set_w16_epi16((int16_t)((ulong)in_stack_ffffffffffffff50 >> 0x10),
                     (int16_t)in_stack_ffffffffffffff50);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  btf_16_adds_subs_avx2(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  btf_16_adds_subs_avx2(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  btf_16_adds_subs_avx2(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  btf_16_adds_subs_avx2(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  btf_16_w16_avx2((__m256i)in_stack_00000178,(__m256i)in_stack_00000158,in_stack_00000150,
                  in_stack_00000148,(__m256i)in_stack_00000118,in_stack_00000114);
  btf_16_w16_avx2((__m256i)in_stack_00000178,(__m256i)in_stack_00000158,in_stack_00000150,
                  in_stack_00000148,(__m256i)in_stack_00000118,in_stack_00000114);
  return;
}

Assistant:

static inline void idct16_stage6_avx2(__m256i *x, const int32_t *cospi,
                                      const __m256i _r, int8_t cos_bit) {
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);
  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  btf_16_adds_subs_avx2(&x[0], &x[7]);
  btf_16_adds_subs_avx2(&x[1], &x[6]);
  btf_16_adds_subs_avx2(&x[2], &x[5]);
  btf_16_adds_subs_avx2(&x[3], &x[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[10], &x[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[11], &x[12], _r, cos_bit);
}